

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QList<Qt::DayOfWeek> * __thiscall QLocale::weekdays(QLocale *this)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  QLocalePrivate *pQVar4;
  QSystemLocale *pQVar5;
  QList<Qt::DayOfWeek> *in_RDI;
  long in_FS_OFFSET;
  int day;
  quint16 weekendEnd;
  quint16 weekendStart;
  QList<Qt::DayOfWeek> *weekdays;
  parameter_type in_stack_ffffffffffffff4c;
  QVariant *in_stack_ffffffffffffff50;
  int local_7c;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d3372);
  if (pQVar4->m_data == &systemLocaleData) {
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (DayOfWeek *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = systemLocale();
    ::QVariant::QVariant((QVariant *)0x4d33bd);
    (*pQVar5->_vptr_QSystemLocale[2])(local_28,pQVar5,0x1e,local_48);
    qvariant_cast<QList<Qt::DayOfWeek>>
              ((QVariant *)
               CONCAT17(in_stack_ffffffffffffff8f,
                        CONCAT16(in_stack_ffffffffffffff8e,
                                 CONCAT24(in_stack_ffffffffffffff8c,
                                          CONCAT22(in_stack_ffffffffffffff8a,
                                                   in_stack_ffffffffffffff88)))));
    ::QVariant::~QVariant(in_stack_ffffffffffffff50);
    ::QVariant::~QVariant(in_stack_ffffffffffffff50);
    bVar1 = QList<Qt::DayOfWeek>::isEmpty((QList<Qt::DayOfWeek> *)0x4d3414);
    if (!bVar1) goto LAB_004d35c3;
    QList<Qt::DayOfWeek>::~QList((QList<Qt::DayOfWeek> *)0x4d3482);
  }
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (DayOfWeek *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<Qt::DayOfWeek>::QList((QList<Qt::DayOfWeek> *)0x4d34c2);
  pQVar4 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d34cc);
  uVar2 = (ushort)((uint)*(undefined4 *)&pQVar4->m_data->field_0x78 >> 8) & 7;
  pQVar4 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d34ea);
  uVar3 = (ushort)(*(uint *)&pQVar4->m_data->field_0x78 >> 0xb) & 7;
  for (local_7c = 1; local_7c < 8; local_7c = local_7c + 1) {
    if (((uVar2 <= uVar3) && ((local_7c < (int)(uint)uVar2 || ((int)(uint)uVar3 < local_7c)))) ||
       ((uVar3 < uVar2 && (((int)(uint)uVar3 < local_7c && (local_7c < (int)(uint)uVar2)))))) {
      QList<Qt::DayOfWeek>::operator<<
                ((QList<Qt::DayOfWeek> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
  }
LAB_004d35c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<Qt::DayOfWeek> QLocale::weekdays() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res
            = qvariant_cast<QList<Qt::DayOfWeek> >(systemLocale()->query(QSystemLocale::Weekdays));
        if (!res.isEmpty())
            return res;
    }
#endif
    QList<Qt::DayOfWeek> weekdays;
    quint16 weekendStart = d->m_data->m_weekend_start;
    quint16 weekendEnd = d->m_data->m_weekend_end;
    for (int day = Qt::Monday; day <= Qt::Sunday; day++) {
        if ((weekendEnd >= weekendStart && (day < weekendStart || day > weekendEnd)) ||
            (weekendEnd < weekendStart && (day > weekendEnd && day < weekendStart)))
                weekdays << static_cast<Qt::DayOfWeek>(day);
    }
    return weekdays;
}